

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QVariant * __thiscall QTableWidgetItem::data(QTableWidgetItem *this,int role)

{
  bool bVar1;
  const_iterator o;
  QWidgetItemData *pQVar2;
  int in_EDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QWidgetItemData *value;
  QList<QWidgetItemData> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  int local_64;
  QVariant *this_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_64 = in_EDX;
  if (in_EDX == 2) {
    local_64 = 0;
  }
  local_10.i = (QWidgetItemData *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_10 = QList<QWidgetItemData>::begin((QList<QWidgetItemData> *)in_RDI);
  o = QList<QWidgetItemData>::end((QList<QWidgetItemData> *)this_00);
  do {
    bVar1 = QList<QWidgetItemData>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) {
      ::QVariant::QVariant((QVariant *)0x8d8f24);
LAB_008d8f24:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    pQVar2 = QList<QWidgetItemData>::const_iterator::operator*(&local_10);
    if (pQVar2->role == local_64) {
      ::QVariant::QVariant(this_00,(QVariant *)&pQVar2->value);
      goto LAB_008d8f24;
    }
    QList<QWidgetItemData>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

QVariant QTableWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (const auto &value : values) {
        if (value.role == role)
            return value.value;
    }
    return QVariant();
}